

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QStringView>::reallocateAndGrow
          (QArrayDataPointer<QStringView> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QStringView> *old)

{
  long lVar1;
  bool bVar2;
  QStringView *pQVar3;
  QPodArrayOps<QStringView> *this_00;
  long in_RCX;
  long in_RDX;
  GrowthPosition in_ESI;
  QArrayDataPointer<QStringView> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<QStringView> dp;
  undefined4 in_stack_ffffffffffffff68;
  AllocationOption in_stack_ffffffffffffff6c;
  QArrayDataPointer<QStringView> *in_stack_ffffffffffffff70;
  QArrayDataPointer<QStringView> *in_stack_ffffffffffffff78;
  QArrayDataPointer<QStringView> *n_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n_00 = in_RDI;
  if ((((in_ESI != GrowsAtEnd) || (in_RCX != 0)) ||
      (bVar2 = needsDetach(in_stack_ffffffffffffff70), bVar2)) || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<QStringView> *)&DAT_aaaaaaaaaaaaaaaa,(qsizetype)n_00,in_ESI);
    if ((0 < in_RDX) &&
       (pQVar3 = data((QArrayDataPointer<QStringView> *)&stack0xffffffffffffffe0),
       pQVar3 == (QStringView *)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        qBadAlloc();
      }
      goto LAB_0053c604;
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach(in_stack_ffffffffffffff70);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QPodArrayOps<QStringView> *)
                  operator->((QArrayDataPointer<QStringView> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QStringView> *)0x53c517);
        begin((QArrayDataPointer<QStringView> *)0x53c526);
        QtPrivate::QPodArrayOps<QStringView>::copyAppend
                  (this_00,(QStringView *)in_stack_ffffffffffffff78,
                   (QStringView *)in_stack_ffffffffffffff70);
      }
      else {
        in_stack_ffffffffffffff70 =
             (QArrayDataPointer<QStringView> *)
             operator->((QArrayDataPointer<QStringView> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QStringView> *)0x53c55f);
        begin((QArrayDataPointer<QStringView> *)0x53c56e);
        QtPrivate::QPodArrayOps<QStringView>::moveAppend
                  ((QPodArrayOps<QStringView> *)in_stack_ffffffffffffff70,
                   (QStringView *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   (QStringView *)0x53c58c);
      }
    }
    swap(in_stack_ffffffffffffff70,
         (QArrayDataPointer<QStringView> *)
         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (in_RCX != 0) {
      swap(in_stack_ffffffffffffff70,
           (QArrayDataPointer<QStringView> *)
           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    ~QArrayDataPointer(in_stack_ffffffffffffff70);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity(in_stack_ffffffffffffff70);
    freeSpaceAtEnd(in_stack_ffffffffffffff78);
    QtPrivate::QPodArrayOps<QStringView>::reallocate
              ((QPodArrayOps<QStringView> *)in_stack_ffffffffffffff78,
               (qsizetype)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_0053c604:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }